

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O1

void keccak_digest(ssh_hash *hash,uchar *output)

{
  byte *pbVar1;
  BinarySink *pBVar2;
  ssh_hashalg *psVar3;
  BinarySink *pBVar4;
  BinarySink *pBVar5;
  keccak_state *s;
  keccak_state *pkVar6;
  ulong uVar7;
  size_t sVar8;
  ssh_hashalg *psVar9;
  bool bVar10;
  uchar padding [200];
  undefined8 local_100;
  uint64_t local_f8 [25];
  
  s = (keccak_state *)(hash + -0x1b);
  psVar9 = (ssh_hashalg *)0x0;
  psVar3 = (ssh_hashalg *)hash[-2].binarysink_;
  if (hash[-1].vt == (ssh_hashalg *)hash[-2].binarysink_) {
    psVar3 = psVar9;
  }
  sVar8 = (long)hash[-1].vt - (long)psVar3;
  local_100 = output;
  memset(local_f8,0,sVar8);
  local_f8[0] = CONCAT71(local_f8[0]._1_7_,(byte)local_f8[0] | *(byte *)&hash[-2].vt);
  pbVar1 = (byte *)((long)local_f8 + (sVar8 - 1));
  *pbVar1 = *pbVar1 | 0x80;
  keccak_accumulate(s,local_f8,sVar8);
  pBVar4 = (BinarySink *)0x0;
  do {
    pBVar5 = pBVar4;
    pkVar6 = s;
    uVar7 = 0;
    do {
      pBVar2 = hash[-1].binarysink_;
      sVar8 = (long)pBVar2 - (long)pBVar5;
      pBVar4 = pBVar5;
      if (sVar8 != 0) {
        if (7 < sVar8) {
          sVar8 = 8;
        }
        local_f8[0] = pkVar6->A[0][0];
        memcpy(local_100 + (long)pBVar5,local_f8,sVar8);
        pBVar4 = (BinarySink *)((long)&pBVar5->write + sVar8);
      }
      if (pBVar2 == pBVar5) break;
      pkVar6 = (keccak_state *)(pkVar6->A + 1);
      bVar10 = uVar7 < 4;
      pBVar5 = pBVar4;
      uVar7 = uVar7 + 1;
    } while (bVar10);
    psVar9 = (ssh_hashalg *)((long)&psVar9->new + 1);
    s = (keccak_state *)(s->A[0] + 1);
    if (psVar9 == (ssh_hashalg *)0x5) {
      return;
    }
  } while( true );
}

Assistant:

static void keccak_digest(ssh_hash *hash, unsigned char *output)
{
    struct keccak_hash *kh = container_of(hash, struct keccak_hash, hash);
    keccak_output(&kh->state, output);
}